

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::SegmentInfo::GetDuration(SegmentInfo *this)

{
  longlong lVar1;
  
  lVar1 = -1;
  if (0.0 <= this->m_duration) {
    lVar1 = (long)((double)this->m_timecodeScale * this->m_duration);
  }
  return lVar1;
}

Assistant:

long long SegmentInfo::GetDuration() const {
  if (m_duration < 0)
    return -1;

  assert(m_timecodeScale >= 1);

  const double dd = double(m_duration) * double(m_timecodeScale);
  const long long d = static_cast<long long>(dd);

  return d;
}